

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  xmlParserErrors code;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  
  if (ctxt->disableSAX < 2) {
    pvVar13 = (void *)0x0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      pxVar3 = ctxt->input;
      pxVar4 = pxVar3->cur;
      xVar1 = *pxVar4;
      if (((xVar1 == '<') && (pxVar4[1] == '!')) && (pxVar4[2] == '[')) {
        iVar2 = pxVar3->id;
        pxVar3->cur = pxVar4 + 3;
        pxVar3->col = pxVar3->col + 3;
        if (pxVar4[3] == '\0') {
          xmlParserGrow(ctxt);
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar3 = ctxt->input;
        pxVar4 = pxVar3->cur;
        if (*pxVar4 == 'I') {
          if (((((pxVar4[1] == 'N') && (pxVar4[2] == 'C')) && (pxVar4[3] == 'L')) &&
              ((pxVar4[4] == 'U' && (pxVar4[5] == 'D')))) && (pxVar4[6] == 'E')) {
            pxVar3->cur = pxVar4 + 7;
            pxVar3->col = pxVar3->col + 7;
            if (pxVar4[7] == '\0') {
              xmlParserGrow(ctxt);
            }
            xmlSkipBlankCharsPE(ctxt);
            if (*ctxt->input->cur != '[') {
LAB_0013a74d:
              code = XML_ERR_CONDSEC_INVALID;
              goto LAB_0013a72a;
            }
            if (ctxt->input->id != iVar2) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "All markup of the conditional section is not in the same entity\n");
            }
            xmlNextChar(ctxt);
            if (uVar11 <= uVar12) {
              iVar10 = (int)uVar11;
              if (iVar10 < 1) {
                uVar8 = 4;
              }
              else {
                uVar8 = 0xffffffff;
                if ((iVar10 < 1000) &&
                   (uVar7 = iVar10 + 1U >> 1, uVar8 = uVar7 + iVar10, (int)(1000 - uVar7) < iVar10))
                {
                  uVar8 = 1000;
                }
              }
              if ((int)uVar8 < 0) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL
                           ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                           "Maximum conditional section nesting depth exceeded\n");
                bVar6 = false;
                bVar5 = true;
              }
              else {
                pvVar9 = (*xmlRealloc)(pvVar13,(ulong)uVar8 * 4);
                if (pvVar9 == (void *)0x0) {
                  xmlCtxtErrMemory(ctxt);
                  bVar5 = true;
                  bVar6 = false;
                }
                else {
                  bVar5 = false;
                  bVar6 = true;
                  uVar11 = (ulong)uVar8;
                  pvVar13 = pvVar9;
                }
              }
              if (!bVar6) goto LAB_0013a73f;
            }
            *(int *)((long)pvVar13 + uVar12 * 4) = iVar2;
            uVar12 = uVar12 + 1;
            bVar5 = false;
          }
          else {
            if (((pxVar4[1] != 'G') || (pxVar4[2] != 'N')) ||
               ((pxVar4[3] != 'O' || ((pxVar4[4] != 'R' || (pxVar4[5] != 'E'))))))
            goto LAB_0013a722;
            pxVar3->cur = pxVar4 + 6;
            pxVar3->col = pxVar3->col + 6;
            if (pxVar4[6] == '\0') {
              xmlParserGrow(ctxt);
            }
            xmlSkipBlankCharsPE(ctxt);
            if (*ctxt->input->cur != '[') goto LAB_0013a74d;
            if (ctxt->input->id != iVar2) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "All markup of the conditional section is not in the same entity\n");
            }
            xmlNextChar(ctxt);
            if (ctxt->disableSAX < 2) {
              lVar14 = 0;
              do {
                pxVar3 = ctxt->input;
                pxVar4 = pxVar3->cur;
                xVar1 = *pxVar4;
                if (xVar1 == '<') {
                  if ((pxVar4[1] != '!') || (pxVar4[2] != '[')) goto LAB_0013a6b5;
                  pxVar3->cur = pxVar4 + 3;
                  pxVar3->col = pxVar3->col + 3;
                  if (pxVar4[3] == '\0') {
                    xmlParserGrow(ctxt);
                  }
                  lVar14 = lVar14 + 1;
                  if (lVar14 == 0) {
                    xmlCtxtErrMemory(ctxt);
                    goto LAB_0013a739;
                  }
                }
                else {
                  if (xVar1 == ']') {
                    if ((pxVar4[1] == ']') && (pxVar4[2] == '>')) {
                      pxVar3->cur = pxVar4 + 3;
                      pxVar3->col = pxVar3->col + 3;
                      if (pxVar4[3] == '\0') {
                        xmlParserGrow(ctxt);
                      }
                      if (lVar14 != 0) {
                        lVar14 = lVar14 + -1;
                        goto LAB_0013a6bd;
                      }
                      break;
                    }
                  }
                  else if (xVar1 == '\0') {
                    xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
                    goto LAB_0013a739;
                  }
LAB_0013a6b5:
                  xmlNextChar(ctxt);
                }
LAB_0013a6bd:
              } while (ctxt->disableSAX < 2);
            }
            bVar5 = false;
            if (ctxt->input->id != iVar2) {
              bVar5 = false;
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "All markup of the conditional section is not in the same entity\n");
            }
          }
        }
        else {
LAB_0013a722:
          code = XML_ERR_CONDSEC_INVALID_KEYWORD;
LAB_0013a72a:
          xmlFatalErr(ctxt,code,(char *)0x0);
          xmlHaltParser(ctxt);
LAB_0013a739:
          bVar5 = true;
        }
LAB_0013a73f:
        if (bVar5) break;
      }
      else if (((uVar12 == 0) || (xVar1 != ']')) || ((pxVar4[1] != ']' || (pxVar4[2] != '>')))) {
        if ((xVar1 != '<') || ((pxVar4[1] != '?' && (pxVar4[1] != '!')))) {
          xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
          xmlHaltParser(ctxt);
          break;
        }
        xmlParseMarkupDecl(ctxt);
      }
      else {
        if (pxVar3->id != *(int *)((long)pvVar13 + uVar12 * 4 + -4)) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "All markup of the conditional section is not in the same entity\n");
        }
        pxVar3 = ctxt->input;
        pxVar4 = pxVar3->cur;
        pxVar3->cur = pxVar4 + 3;
        pxVar3->col = pxVar3->col + 3;
        uVar12 = uVar12 - 1;
        if (pxVar4[3] == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      if (uVar12 == 0) break;
      xmlSkipBlankCharsPE(ctxt);
      if ((ctxt->input->flags & 0x40) == 0) {
        xmlParserShrink(ctxt);
      }
      pxVar3 = ctxt->input;
      if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
    } while (ctxt->disableSAX < 2);
  }
  else {
    pvVar13 = (void *)0x0;
  }
  (*xmlFree)(pvVar13);
  return;
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    while (PARSER_STOPPED(ctxt) == 0) {
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            int id = ctxt->input->id;

            SKIP(3);
            SKIP_BLANKS_PE;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(inputIdsSize, sizeof(tmp[0]),
                                              4, 1000);
                    if (newSize < 0) {
                        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                                       "Maximum conditional section nesting"
                                       " depth exceeded\n");
                        goto error;
                    }
                    tmp = xmlRealloc(inputIds, newSize * sizeof(tmp[0]));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt);
                        goto error;
                    }
                    inputIds = tmp;
                    inputIdsSize = newSize;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                while (PARSER_STOPPED(ctxt) == 0) {
                    if (RAW == 0) {
                        xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                        goto error;
                    }
                    if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                        SKIP(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (NXT(2) == '>')) {
                        SKIP(3);
                        if (ignoreDepth == 0)
                            break;
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP(3);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            goto error;
        }

        if (depth == 0)
            break;

        SKIP_BLANKS_PE;
        SHRINK;
        GROW;
    }

error:
    xmlFree(inputIds);
}